

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadCertificate.h
# Opt level: O0

string * build_path(string *__return_storage_ptr__,string *crt_dirpath,string *domain_name,
                   string *crt_filename)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *crt_filename_local;
  string *domain_name_local;
  string *crt_dirpath_local;
  
  local_28 = crt_filename;
  crt_filename_local = domain_name;
  domain_name_local = crt_dirpath;
  crt_dirpath_local = __return_storage_ptr__;
  std::operator+(&local_88,crt_dirpath,"/");
  std::operator+(&local_68,&local_88,crt_filename_local);
  std::operator+(&local_48,&local_68,"/");
  std::operator+(__return_storage_ptr__,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string build_path(const std::string& crt_dirpath,
                         const std::string& domain_name, 
                           const std::string& crt_filename) {
    return crt_dirpath + "/" + domain_name + "/" + crt_filename;
}